

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O3

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
worker_thread<directed_flag_complex_in_memory_computer::store_coboundaries_in_cache_t>
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,int number_of_threads,
          int thread_id,store_coboundaries_in_cache_t *f,int min_dimension,int max_dimension)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  vector<unsigned_short,_std::allocator<unsigned_short>_> prefix;
  allocator_type local_4d;
  int local_4c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  iVar1 = *(int *)&(this->vertex_cells).
                   super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(this->vertex_cells).
                   super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_4c = min_dimension;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_48,(long)(max_dimension + 1),&local_4d);
  for (uVar3 = thread_id & 0xffff; uVar3 < (((uint)(iVar1 - iVar2) >> 3) * -0x55555555 & 0xffff);
      uVar3 = uVar3 + number_of_threads & 0xffff) {
    directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
    for_each_cell<directed_flag_complex_in_memory_computer::store_coboundaries_in_cache_t>
              ((this->vertex_cells).
               super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar3,f,local_4c,max_dimension,
               local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start,0);
  }
  directed_flag_complex_in_memory_computer::store_coboundaries_in_cache_t::done(f);
  if (local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (vertex_index_t *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void worker_thread(int number_of_threads, int thread_id, Func& f, int min_dimension, int max_dimension) {
		const vertex_index_t number_of_vertices = vertex_index_t(vertex_cells.size());

		std::vector<vertex_index_t> prefix(max_dimension + 1);

		for (vertex_index_t index = thread_id; index < number_of_vertices; index += number_of_threads) {
			vertex_cells[index].for_each_cell(f, min_dimension, max_dimension, prefix.data());
		}

		f.done();
	}